

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.hpp
# Opt level: O1

double __thiscall
Curve<3,_2>::findClosestParameter
          (Curve<3,_2> *this,PointType *point,double init_param,int *max_iter)

{
  int iVar1;
  double dVar2;
  double dVar3;
  PointType second_order;
  PointType first_order;
  double local_78;
  undefined4 local_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  double dStack_60;
  PointType *local_50;
  double local_48;
  double dStack_40;
  
  local_78 = init_param;
  if (0 < *max_iter) {
    if (0 < *max_iter) {
      iVar1 = 0;
      local_50 = point;
      do {
        local_68 = 0;
        (*this->_vptr_Curve[2])(&local_48,this,&local_78,&local_68);
        local_68 = 1;
        (*this->_vptr_Curve[2])(&local_48,this,&local_78,&local_68);
        local_6c = 2;
        (*this->_vptr_Curve[2])(&local_68,this,&local_78,&local_6c);
        dVar2 = local_48 -
                (local_50->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                m_data.array[0];
        dVar3 = dStack_40 -
                (local_50->super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>).m_storage.
                m_data.array[1];
        local_78 = local_78 -
                   (dVar3 * dStack_40 + dVar2 * local_48) /
                   (dStack_40 * dStack_40 + local_48 * local_48 +
                    dVar3 * dStack_60 + dVar2 * (double)CONCAT44(uStack_64,local_68) +
                   2.2250738585072014e-308);
        iVar1 = iVar1 + 1;
      } while (iVar1 < *max_iter);
    }
    return local_78;
  }
  __assert_fail("max_iter > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/tanzby[P]ParametricCurve/src/curve.hpp"
                ,0x43,
                "virtual double Curve<>::findClosestParameter(const PointType &, double, const int &) const [N = 3, PointDim = 2]"
               );
}

Assistant:

virtual auto findClosestParameter(const PointType& point,
                                    double init_param,
                                    const int& max_iter = 20) const -> double {
    /**
     * 找到参数u使得离点p是最近的，即求解
     * f = (C(u)-p)*C'(u) = 0
     * f'= C'(u)*C'(u) + (C(u)-p)*C''(u)
     * 当给定u_{n+1} = u_{n} - f/f'
     */
    assert(max_iter > 0);
    double numerator;
    double denominator;
    for (int iter = 0; iter < max_iter; ++iter) {
      auto d = this->at(init_param) - point;
      auto first_order = this->at(init_param, 1);
      auto second_order = this->at(init_param, 2);

      numerator = d.dot(first_order);
      denominator =
          first_order.dot(first_order) + d.dot(second_order) + std::numeric_limits<double>::min();
      init_param = init_param - numerator / denominator;
    }

    return init_param;
  }